

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric.cpp
# Opt level: O2

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> __thiscall
duckdb::DecimalUnaryOpBind<duckdb::AbsOperator>
          (duckdb *this,ClientContext *context,ScalarFunction *bound_function,
          vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
          *arguments)

{
  reference this_00;
  pointer pEVar1;
  reference this_01;
  LogicalType LStack_68;
  scalar_function_t local_50;
  LogicalType decimal_type;
  
  this_00 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
            ::get<true>(arguments,0);
  pEVar1 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     (this_00);
  LogicalType::LogicalType(&decimal_type,&pEVar1->return_type);
  if (decimal_type.physical_type_ == INT64) {
    LogicalType::LogicalType(&LStack_68,BIGINT);
    ScalarFunction::GetScalarUnaryFunction<duckdb::AbsOperator>(&local_50,&LStack_68);
  }
  else if (decimal_type.physical_type_ == INT32) {
    LogicalType::LogicalType(&LStack_68,INTEGER);
    ScalarFunction::GetScalarUnaryFunction<duckdb::AbsOperator>(&local_50,&LStack_68);
  }
  else if (decimal_type.physical_type_ == INT16) {
    LogicalType::LogicalType(&LStack_68,SMALLINT);
    ScalarFunction::GetScalarUnaryFunction<duckdb::AbsOperator>(&local_50,&LStack_68);
  }
  else {
    LogicalType::LogicalType(&LStack_68,HUGEINT);
    ScalarFunction::GetScalarUnaryFunction<duckdb::AbsOperator>(&local_50,&LStack_68);
  }
  ::std::function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>::
  operator=(&bound_function->function,&local_50);
  ::std::_Function_base::~_Function_base(&local_50.super__Function_base);
  LogicalType::~LogicalType(&LStack_68);
  this_01 = vector<duckdb::LogicalType,_true>::get<true>
                      (&(bound_function->super_BaseScalarFunction).super_SimpleFunction.arguments,0)
  ;
  LogicalType::operator=(this_01,&decimal_type);
  LogicalType::operator=(&(bound_function->super_BaseScalarFunction).return_type,&decimal_type);
  *(undefined8 *)this = 0;
  LogicalType::~LogicalType(&decimal_type);
  return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
         (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)this;
}

Assistant:

unique_ptr<FunctionData> DecimalUnaryOpBind(ClientContext &context, ScalarFunction &bound_function,
                                            vector<unique_ptr<Expression>> &arguments) {
	auto decimal_type = arguments[0]->return_type;
	switch (decimal_type.InternalType()) {
	case PhysicalType::INT16:
		bound_function.function = ScalarFunction::GetScalarUnaryFunction<OP>(LogicalTypeId::SMALLINT);
		break;
	case PhysicalType::INT32:
		bound_function.function = ScalarFunction::GetScalarUnaryFunction<OP>(LogicalTypeId::INTEGER);
		break;
	case PhysicalType::INT64:
		bound_function.function = ScalarFunction::GetScalarUnaryFunction<OP>(LogicalTypeId::BIGINT);
		break;
	default:
		bound_function.function = ScalarFunction::GetScalarUnaryFunction<OP>(LogicalTypeId::HUGEINT);
		break;
	}
	bound_function.arguments[0] = decimal_type;
	bound_function.return_type = decimal_type;
	return nullptr;
}